

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

bool * __thiscall google::protobuf::RepeatedField<bool>::elements(RepeatedField<bool> *this)

{
  bool *pbVar1;
  RepeatedField<bool> *in_RDI;
  
  pbVar1 = unsafe_elements(in_RDI);
  return pbVar1;
}

Assistant:

Element* elements() const {
    GOOGLE_DCHECK_GT(total_size_, 0);
    // Because of above pre-condition this cast is safe.
    return unsafe_elements();
  }